

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

void __thiscall i2p::sam::Session::DestGenerate(Session *this,Sock *sock)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  Reply *reply;
  Reply *in_stack_fffffffffffffe98;
  Reply *this_00;
  string *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  Reply *this_01;
  allocator<char> local_101;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  allocator<char> local_e1 [160];
  undefined1 in_stack_ffffffffffffffbf;
  string *in_stack_ffffffffffffffc0;
  Sock *in_stack_ffffffffffffffc8;
  Session *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_stack_fffffffffffffee0,(allocator<char> *)in_stack_fffffffffffffed8);
  SendRequestAndGetReply
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (bool)in_stack_ffffffffffffffbf);
  std::__cxx11::string::~string(&in_stack_fffffffffffffe98->full);
  std::allocator<char>::~allocator(local_e1);
  this_00 = (Reply *)(local_e1 + 0x61);
  this_01 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,(char *)this_01,(allocator<char> *)in_stack_fffffffffffffed8);
  Reply::Get(this_01,in_stack_fffffffffffffed8);
  DecodeI2PBase64(in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,&local_100);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::__cxx11::string::~string(&in_stack_fffffffffffffe98->full);
  std::__cxx11::string::~string(&in_stack_fffffffffffffe98->full);
  std::allocator<char>::~allocator(&local_101);
  Reply::~Reply(in_stack_fffffffffffffe98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Session::DestGenerate(const Sock& sock)
{
    // https://geti2p.net/spec/common-structures#key-certificates
    // "7" or "EdDSA_SHA512_Ed25519" - "Recent Router Identities and Destinations".
    // Use "7" because i2pd <2.24.0 does not recognize the textual form.
    // If SIGNATURE_TYPE is not specified, then the default one is DSA_SHA1.
    const Reply& reply = SendRequestAndGetReply(sock, "DEST GENERATE SIGNATURE_TYPE=7", false);

    m_private_key = DecodeI2PBase64(reply.Get("PRIV"));
}